

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDeviceOrModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *deviceOrModuleCreateInfo,
          IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo)

{
  char cVar1;
  IOTHUB_REGISTRYMANAGER_AUTH_METHOD IVar2;
  IOTHUB_REGISTRYMANAGER_RESULT IVar3;
  LOGGER_LOG p_Var4;
  ushort **ppuVar5;
  IOTHUB_DEVICE_OR_MODULE *deviceOrModuleInfo_00;
  BUFFER_HANDLE deviceJsonBuffer;
  BUFFER_HANDLE responseBuffer;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (deviceOrModuleCreateInfo == (IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE *)0x0 ||
      deviceOrModuleInfo == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar7 = "Input parameter cannot be NULL";
    iVar6 = 0x56d;
  }
  else {
    memset(deviceOrModuleInfo,0,0xa0);
    deviceOrModuleInfo->connectionState = IOTHUB_DEVICE_CONNECTION_STATE_DISCONNECTED;
    deviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_DISABLED;
    pcVar7 = deviceOrModuleCreateInfo->deviceId;
    pcVar8 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      }
      pcVar7 = "deviceId cannot be NULL";
      iVar6 = 0x576;
    }
    else {
      do {
        cVar1 = *pcVar8;
        if ((long)cVar1 == 0) {
          IVar2 = deviceOrModuleCreateInfo->authMethod;
          if (IVar2 < IOTHUB_REGISTRYMANAGER_AUTH_UNKNOWN) {
            deviceOrModuleInfo_00 = (IOTHUB_DEVICE_OR_MODULE *)calloc(1,0xa0);
            if (deviceOrModuleInfo_00 == (IOTHUB_DEVICE_OR_MODULE *)0x0) {
              p_Var4 = xlogging_get_log_function();
              IVar3 = IOTHUB_REGISTRYMANAGER_ERROR;
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_001358ca;
              pcVar7 = "Malloc failed for tempDeviceOrModuleInfo";
              iVar6 = 0x588;
            }
            else {
              deviceOrModuleInfo_00->deviceId = pcVar7;
              pcVar7 = deviceOrModuleCreateInfo->secondaryKey;
              deviceOrModuleInfo_00->primaryKey = deviceOrModuleCreateInfo->primaryKey;
              deviceOrModuleInfo_00->secondaryKey = pcVar7;
              deviceOrModuleInfo_00->authMethod = IVar2;
              deviceOrModuleInfo_00->iotEdge_capable = deviceOrModuleCreateInfo->iotEdge_capable;
              pcVar7 = deviceOrModuleCreateInfo->managedBy;
              deviceOrModuleInfo_00->moduleId = deviceOrModuleCreateInfo->moduleId;
              deviceOrModuleInfo_00->managedBy = pcVar7;
              deviceJsonBuffer = constructDeviceOrModuleJson(deviceOrModuleInfo_00);
              if (deviceJsonBuffer != (BUFFER_HANDLE)0x0) {
                responseBuffer = BUFFER_new();
                if (responseBuffer == (BUFFER_HANDLE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  IVar3 = IOTHUB_REGISTRYMANAGER_ERROR;
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"IoTHubRegistryManager_CreateDeviceOrModule",0x5a1,1,
                              "BUFFER_new failed for responseBuffer");
                  }
                }
                else {
                  IVar3 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_CREATE,
                                              deviceOrModuleCreateInfo->deviceId,
                                              deviceOrModuleCreateInfo->moduleId,deviceJsonBuffer,0,
                                              responseBuffer);
                  if (IVar3 == IOTHUB_REGISTRYMANAGER_OK) {
                    IVar3 = parseDeviceOrModuleJson(responseBuffer,deviceOrModuleInfo);
                  }
                  else if (IVar3 == IOTHUB_REGISTRYMANAGER_ERROR) {
                    p_Var4 = xlogging_get_log_function();
                    IVar3 = IOTHUB_REGISTRYMANAGER_ERROR;
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                ,"IoTHubRegistryManager_CreateDeviceOrModule",0x5a6,1,
                                "Failure sending HTTP request for create device");
                    }
                  }
                  BUFFER_delete(responseBuffer);
                }
                BUFFER_delete(deviceJsonBuffer);
                goto LAB_001358ca;
              }
              p_Var4 = xlogging_get_log_function();
              IVar3 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_001358ca;
              pcVar7 = "Json creation failed";
              iVar6 = 0x59c;
            }
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"IoTHubRegistryManager_CreateDeviceOrModule",iVar6,1,pcVar7);
LAB_001358ca:
            free(deviceOrModuleInfo_00);
            return IVar3;
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) {
            return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
          }
          pcVar7 = "Invalid authorization type specified";
          iVar6 = 0x580;
          goto LAB_001357f0;
        }
        ppuVar5 = __ctype_b_loc();
        pcVar8 = pcVar8 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0);
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      }
      pcVar7 = "deviceId cannot contain spaces";
      iVar6 = 0x57b;
    }
  }
LAB_001357f0:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_CreateDeviceOrModule",iVar6,1,pcVar7);
  return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDeviceOrModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE* deviceOrModuleCreateInfo, IOTHUB_DEVICE_OR_MODULE* deviceOrModuleInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleCreateInfo == NULL) || (deviceOrModuleInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        initializeDeviceOrModuleInfoMembers(deviceOrModuleInfo);

        if (deviceOrModuleCreateInfo->deviceId == NULL)
        {
            LogError("deviceId cannot be NULL");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if ((strHasNoWhitespace(deviceOrModuleCreateInfo->deviceId)) != 0)
        {
            LogError("deviceId cannot contain spaces");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else if (isAuthTypeAllowed(deviceOrModuleCreateInfo->authMethod) == false)
        {
            LogError("Invalid authorization type specified");
            result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
        }
        else
        {
            IOTHUB_DEVICE_OR_MODULE* tempDeviceOrModuleInfo;
            if ((tempDeviceOrModuleInfo = malloc(sizeof(IOTHUB_DEVICE_OR_MODULE))) == NULL)
            {
                LogError("Malloc failed for tempDeviceOrModuleInfo");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else
            {
                memset(tempDeviceOrModuleInfo, 0, sizeof(*tempDeviceOrModuleInfo));
                tempDeviceOrModuleInfo->deviceId = deviceOrModuleCreateInfo->deviceId;
                tempDeviceOrModuleInfo->moduleId = deviceOrModuleCreateInfo->moduleId;
                tempDeviceOrModuleInfo->primaryKey = deviceOrModuleCreateInfo->primaryKey;
                tempDeviceOrModuleInfo->secondaryKey = deviceOrModuleCreateInfo->secondaryKey;
                tempDeviceOrModuleInfo->authMethod = deviceOrModuleCreateInfo->authMethod;
                tempDeviceOrModuleInfo->status = IOTHUB_DEVICE_STATUS_ENABLED;
                tempDeviceOrModuleInfo->iotEdge_capable = deviceOrModuleCreateInfo->iotEdge_capable;
                tempDeviceOrModuleInfo->managedBy = deviceOrModuleCreateInfo->managedBy;

                BUFFER_HANDLE deviceJsonBuffer = NULL;
                BUFFER_HANDLE responseBuffer = NULL;

                if ((deviceJsonBuffer = constructDeviceOrModuleJson(tempDeviceOrModuleInfo)) == NULL)
                {
                    LogError("Json creation failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else if ((responseBuffer = BUFFER_new()) == NULL)
                {
                    LogError("BUFFER_new failed for responseBuffer");
                    result = IOTHUB_REGISTRYMANAGER_ERROR;
                }
                else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_CREATE, deviceOrModuleCreateInfo->deviceId, deviceOrModuleCreateInfo->moduleId, deviceJsonBuffer, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
                {
                    LogError("Failure sending HTTP request for create device");
                }
                else if (result == IOTHUB_REGISTRYMANAGER_OK)
                {
                    result = parseDeviceOrModuleJson(responseBuffer, deviceOrModuleInfo);
                }
                else
                {
                }

                if (responseBuffer != NULL)
                {
                    BUFFER_delete(responseBuffer);
                }
                if (deviceJsonBuffer != NULL)
                {
                    BUFFER_delete(deviceJsonBuffer);
                }
            }
            free(tempDeviceOrModuleInfo);
        }
    }
    return result;
}